

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFileDaily.cpp
# Opt level: O2

void __thiscall liblogger::LogFileDaily::RemoveOld(LogFileDaily *this)

{
  string *__lhs;
  int iVar1;
  DIR *__dirp;
  size_t sVar2;
  int *piVar3;
  dirent *pdVar4;
  ostream *poVar5;
  char *pcVar6;
  LogException *pLVar7;
  int time;
  int oldest;
  string prefix;
  string file;
  time_t current;
  string local_7a0;
  stringstream ss_1;
  ostream local_770 [376];
  stringstream ss2;
  ostream local_5e8 [376];
  tm timeinfo;
  char strtime [1024];
  
  if (0 < this->m_maxage) {
    __lhs = &this->m_dir;
    __dirp = opendir((this->m_dir)._M_dataplus._M_p);
    if (__dirp == (DIR *)0x0) {
      std::__cxx11::stringstream::stringstream((stringstream *)strtime);
      poVar5 = std::operator<<((ostream *)(strtime + 0x10),"Unable to open directory \'");
      poVar5 = std::operator<<(poVar5,(string *)__lhs);
      poVar5 = std::operator<<(poVar5,"\' error:");
      piVar3 = __errno_location();
      pcVar6 = strerror(*piVar3);
      std::operator<<(poVar5,pcVar6);
      pLVar7 = (LogException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LogException::LogException(pLVar7,(string *)&ss_1);
      __cxa_throw(pLVar7,&LogException::typeinfo,LogException::~LogException);
    }
    current = ::time((time_t *)0x0);
    localtime_r(&current,(tm *)&timeinfo);
    sVar2 = strftime(strtime,0x400,"%Y%m%d",(tm *)&timeinfo);
    if (sVar2 == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss_1);
      poVar5 = std::operator<<(local_770,"strftime failed: \'");
      poVar5 = std::operator<<(poVar5,"\' error: ");
      piVar3 = __errno_location();
      pcVar6 = strerror(*piVar3);
      std::operator<<(poVar5,pcVar6);
      iVar1 = closedir(__dirp);
      if (iVar1 < 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss2);
        poVar5 = std::operator<<(local_5e8,"Unable to close directory \'");
        poVar5 = std::operator<<(poVar5,(string *)__lhs);
        poVar5 = std::operator<<(poVar5,"\' error:");
        pcVar6 = strerror(*piVar3);
        std::operator<<(poVar5,pcVar6);
        pLVar7 = (LogException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        LogException::LogException(pLVar7,&prefix);
        __cxa_throw(pLVar7,&LogException::typeinfo,LogException::~LogException);
      }
      pLVar7 = (LogException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LogException::LogException(pLVar7,(string *)&ss2);
      __cxa_throw(pLVar7,&LogException::typeinfo,LogException::~LogException);
    }
    oldest = 0;
    iVar1 = __isoc99_sscanf(strtime,"%d");
    if (iVar1 != 1) {
      abort();
    }
    oldest = oldest - this->m_maxage;
    piVar3 = __errno_location();
    while( true ) {
      *piVar3 = 0;
      pdVar4 = readdir(__dirp);
      if (pdVar4 == (dirent *)0x0) break;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ss2,pdVar4->d_name,(allocator<char> *)&ss_1);
      std::operator+(&prefix,&this->m_prefix,"-");
      iVar1 = std::__cxx11::string::compare((ulong)&ss2,0,(string *)prefix._M_string_length);
      if (iVar1 == 0) {
        time = 0;
        iVar1 = __isoc99_sscanf(_ss2 + prefix._M_string_length,"%d",&time);
        if ((iVar1 == 1) && (time < oldest)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_1,
                         __lhs,"/");
          std::operator+(&file,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ss_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss2);
          std::__cxx11::string::~string((string *)&ss_1);
          iVar1 = unlink(file._M_dataplus._M_p);
          if (iVar1 < 0) {
            std::__cxx11::stringstream::stringstream((stringstream *)&ss_1);
            poVar5 = std::operator<<(local_770,"Unable to remove file \'");
            poVar5 = std::operator<<(poVar5,file._M_dataplus._M_p);
            poVar5 = std::operator<<(poVar5,"\' error:");
            pcVar6 = strerror(*piVar3);
            std::operator<<(poVar5,pcVar6);
            pLVar7 = (LogException *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            LogException::LogException(pLVar7,&local_7a0);
            __cxa_throw(pLVar7,&LogException::typeinfo,LogException::~LogException);
          }
          std::__cxx11::string::~string((string *)&file);
        }
      }
      std::__cxx11::string::~string((string *)&prefix);
      std::__cxx11::string::~string((string *)&ss2);
    }
    if (*piVar3 != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss_1);
      poVar5 = std::operator<<(local_770,"readdir failed in \'");
      poVar5 = std::operator<<(poVar5,(string *)__lhs);
      poVar5 = std::operator<<(poVar5,"\' error:");
      pcVar6 = strerror(*piVar3);
      std::operator<<(poVar5,pcVar6);
      iVar1 = closedir(__dirp);
      if (iVar1 < 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss2);
        poVar5 = std::operator<<(local_5e8,"Unable to close directory \'");
        poVar5 = std::operator<<(poVar5,(string *)__lhs);
        poVar5 = std::operator<<(poVar5,"\' error:");
        pcVar6 = strerror(*piVar3);
        std::operator<<(poVar5,pcVar6);
        pLVar7 = (LogException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        LogException::LogException(pLVar7,&prefix);
        __cxa_throw(pLVar7,&LogException::typeinfo,LogException::~LogException);
      }
      pLVar7 = (LogException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LogException::LogException(pLVar7,(string *)&ss2);
      __cxa_throw(pLVar7,&LogException::typeinfo,LogException::~LogException);
    }
    iVar1 = closedir(__dirp);
    if (iVar1 < 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss_1);
      poVar5 = std::operator<<(local_770,"Unable to close directory \'");
      poVar5 = std::operator<<(poVar5,(string *)__lhs);
      poVar5 = std::operator<<(poVar5,"\' error:");
      pcVar6 = strerror(*piVar3);
      std::operator<<(poVar5,pcVar6);
      pLVar7 = (LogException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LogException::LogException(pLVar7,(string *)&ss2);
      __cxa_throw(pLVar7,&LogException::typeinfo,LogException::~LogException);
    }
  }
  return;
}

Assistant:

void LogFileDaily::RemoveOld()
{

	if (m_maxage <= 0)
		return;

	DIR *d = opendir(m_dir.c_str());
	if (d == NULL)
	{
		std::stringstream ss;
		ss << "Unable to open directory '" << m_dir << "' error:" << strerror(errno);
		throw(LogException(ss.str()));
	}

	time_t current = time(NULL);
	struct tm timeinfo;
	char strtime[1024];

	localtime_r(&current, &timeinfo);

	if (strftime(strtime, sizeof(strtime), "%Y%m%d", &timeinfo) == 0)
	{
		std::stringstream ss;
		ss << "strftime failed: '" << "' error: " << strerror(errno);
		if (closedir(d) < 0)
		{
			std::stringstream ss2;
			ss2 << "Unable to close directory '" << m_dir << "' error:" << strerror(errno);
			throw(LogException(ss2.str()));
		}
		throw(LogException(ss.str()));
	}

	int oldest = 0;
	if (sscanf(strtime, "%d", &oldest) != 1)
		abort();
	oldest -= m_maxage;

	while(1)
	{
		errno = 0;
		struct dirent *info = readdir(d);
		if (info == NULL)
			break; //EOF
		std::string fname = info->d_name;
		std::string prefix = m_prefix + "-";
		if (fname.compare(0, prefix.length(), prefix) == 0)
		{
			//Parse and comare time.
			int time = 0;
			if (sscanf(&fname.c_str()[prefix.length()], "%d", &time) == 1)
			{
				if (time < oldest)
				{
					std::string file = m_dir + "/" + fname;
					if (unlink(file.c_str()) < 0)
					{
						std::stringstream ss;
						ss << "Unable to remove file '" << file.c_str() << "' error:" << strerror(errno);
						throw(LogException(ss.str()));
					}
				}
			}
			else
			{
				//Cant parse
			}
		}
	}

	if (errno != 0)
	{
		std::stringstream ss;
		ss << "readdir failed in '" << m_dir << "' error:" << strerror(errno);
		if (closedir(d) < 0)
		{
			std::stringstream ss2;
			ss2 << "Unable to close directory '" << m_dir << "' error:" << strerror(errno);
			throw(LogException(ss2.str()));
		}
		throw(LogException(ss.str()));
	}



	if (closedir(d) < 0)
	{
		std::stringstream ss;
		ss << "Unable to close directory '" << m_dir << "' error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
}